

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

void __thiscall icu_63::UnicodeSetStringSpan::addToSpanNotSet(UnicodeSetStringSpan *this,UChar32 c)

{
  UnicodeSet *this_00;
  UBool UVar1;
  UnicodeSet *this_01;
  
  this_01 = this->pSpanNotSet;
  this_00 = &this->spanSet;
  if (this_01 != this_00 && this_01 != (UnicodeSet *)0x0) {
LAB_001a4c3d:
    UnicodeSet::add(this_01,c);
    return;
  }
  UVar1 = UnicodeSet::contains(this_00,c);
  if (UVar1 == '\0') {
    this_01 = (UnicodeSet *)UnicodeSet::cloneAsThawed(this_00);
    if (this_01 != (UnicodeSet *)0x0) {
      this->pSpanNotSet = this_01;
      goto LAB_001a4c3d;
    }
  }
  return;
}

Assistant:

void UnicodeSetStringSpan::addToSpanNotSet(UChar32 c) {
    if(pSpanNotSet==NULL || pSpanNotSet==&spanSet) {
        if(spanSet.contains(c)) {
            return;  // Nothing to do.
        }
        UnicodeSet *newSet=(UnicodeSet *)spanSet.cloneAsThawed();
        if(newSet==NULL) {
            return;  // Out of memory.
        } else {
            pSpanNotSet=newSet;
        }
    }
    pSpanNotSet->add(c);
}